

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(TreeEnsembleClassifier *a,TreeEnsembleClassifier *b)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  TreeEnsemblePostEvaluationTransform TVar3;
  ClassLabelsCase CVar4;
  ClassLabelsCase CVar5;
  TreeEnsembleParameters *a_00;
  TreeEnsembleParameters *b_00;
  Int64Vector *a_01;
  Int64Vector *b_01;
  StringVector *a_02;
  StringVector *b_02;
  TreeEnsembleClassifier *b_local;
  TreeEnsembleClassifier *a_local;
  
  a_00 = TreeEnsembleClassifier::treeensemble(a);
  b_00 = TreeEnsembleClassifier::treeensemble(b);
  bVar1 = operator!=(a_00,b_00);
  if (bVar1) {
    a_local._7_1_ = false;
  }
  else {
    TVar2 = TreeEnsembleClassifier::postevaluationtransform(a);
    TVar3 = TreeEnsembleClassifier::postevaluationtransform(b);
    if (TVar2 == TVar3) {
      CVar4 = TreeEnsembleClassifier::ClassLabels_case(a);
      CVar5 = TreeEnsembleClassifier::ClassLabels_case(b);
      if (CVar4 == CVar5) {
        CVar4 = TreeEnsembleClassifier::ClassLabels_case(a);
        if (CVar4 == CLASSLABELS_NOT_SET) {
          a_local._7_1_ = true;
        }
        else if (CVar4 == kStringClassLabels) {
          a_02 = TreeEnsembleClassifier::stringclasslabels(a);
          b_02 = TreeEnsembleClassifier::stringclasslabels(b);
          a_local._7_1_ = operator==(a_02,b_02);
        }
        else if (CVar4 == kInt64ClassLabels) {
          a_01 = TreeEnsembleClassifier::int64classlabels(a);
          b_01 = TreeEnsembleClassifier::int64classlabels(b);
          a_local._7_1_ = operator==(a_01,b_01);
        }
        else {
          a_local._7_1_ = true;
        }
      }
      else {
        a_local._7_1_ = false;
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const TreeEnsembleClassifier& a,
                        const TreeEnsembleClassifier& b) {
            if (a.treeensemble() != b.treeensemble()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case TreeEnsembleClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case TreeEnsembleClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case TreeEnsembleClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            return true;
        }